

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_struct_as_typed_root_with_size
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,size_t size,uint16_t align)

{
  int iVar1;
  flatbuffers_uoffset_t end;
  flatbuffers_uoffset_t offset;
  uint16_t align_local;
  size_t size_local;
  size_t sStack_20;
  flatbuffers_thash_t thash_local;
  size_t bufsiz_local;
  void *buf_local;
  
  sStack_20 = bufsiz;
  bufsiz_local = (size_t)buf;
  iVar1 = flatcc_verify_typed_buffer_header_with_size(buf,&stack0xffffffffffffffe0,thash);
  if (iVar1 == 0) {
    end = (flatbuffers_uoffset_t)sStack_20;
    offset = read_uoffset((void *)bufsiz_local,4);
    buf_local._4_4_ = verify_struct(end,4,offset,(flatbuffers_uoffset_t)size,align);
  }
  else {
    buf_local._4_4_ =
         flatcc_verify_typed_buffer_header_with_size
                   ((void *)bufsiz_local,&stack0xffffffffffffffe0,thash);
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_struct_as_typed_root_with_size(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, size_t size, uint16_t align)
{
    check_result(flatcc_verify_typed_buffer_header_with_size(buf, &bufsiz, thash));
    return verify_struct((uoffset_t)bufsiz, uoffset_size, read_uoffset(buf, uoffset_size), (uoffset_t)size, align);
}